

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O0

void __thiscall Centaurus::DFA<char>::fork_states(DFA<char> *this,int index,NFA<char> *nfa)

{
  bool bVar1;
  int dest;
  reference pvVar2;
  IndexVector *pIVar3;
  reference piVar4;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *this_00;
  size_type sVar5;
  reference cc;
  int local_118;
  int i_1;
  int new_index;
  set<int,_std::less<int>,_std::allocator<int>_> ec;
  bool long_flag;
  pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *item;
  iterator __end0_2;
  iterator __begin0_2;
  NFADepartureSet<char> *__range2_1;
  undefined1 local_b0 [4];
  int initial_index;
  NFADepartureSet<char> deptset;
  NFATransition<char> *tr;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range3
  ;
  const_iterator cStack_68;
  int i;
  const_iterator __end0;
  const_iterator __begin0;
  IndexVector *__range2;
  NFADepartureSetFactory<char> ds_factory;
  NFA<char> *nfa_local;
  int index_local;
  DFA<char> *this_local;
  
  ds_factory.m_transitions.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nfa;
  NFADepartureSetFactory<char>::NFADepartureSetFactory((NFADepartureSetFactory<char> *)&__range2);
  pvVar2 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
           operator[](&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,(long)index);
  pIVar3 = NFABaseState<char,_Centaurus::IndexVector>::label
                     (&pvVar2->super_NFABaseState<char,_Centaurus::IndexVector>);
  __end0 = std::vector<int,_std::allocator<int>_>::begin
                     (&pIVar3->super_vector<int,_std::allocator<int>_>);
  cStack_68 = std::vector<int,_std::allocator<int>_>::end
                        (&pIVar3->super_vector<int,_std::allocator<int>_>);
  while (bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff98), bVar1) {
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end0);
    this_00 = NFA<char>::get_transitions
                        ((NFA<char> *)
                         ds_factory.m_transitions.
                         super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,*piVar4);
    __end0_1 = std::
               vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
               ::begin(this_00);
    tr = (NFATransition<char> *)
         std::
         vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
         end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                               *)&tr), bVar1) {
      deptset.
      super_vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      .
      super__Vector_base<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                    ::operator*(&__end0_1);
      NFADepartureSetFactory<char>::add
                ((NFADepartureSetFactory<char> *)&__range2,
                 (NFATransition<char> *)
                 deptset.
                 super_vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 .
                 super__Vector_base<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  NFADepartureSetFactory<char>::build_departure_set
            ((NFADepartureSet<char> *)local_b0,(NFADepartureSetFactory<char> *)&__range2);
  sVar5 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::size
                    (&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states);
  local_118 = (int)sVar5;
  __end0_2 = std::
             vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::begin((vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      *)&deptset);
  item = (pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
         std::
         vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         ::end((vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)&deptset);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_2,
                            (__normal_iterator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                             *)&item), bVar1) {
    cc = __gnu_cxx::
         __normal_iterator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
         ::operator*(&__end0_2);
    ec._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    NFA<char>::epsilon_closure
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,
               (NFA<char> *)
               ds_factory.m_transitions.
               super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,&cc->second,
               (bool *)((long)&ec._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    dest = add_state(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,
                     (bool)(ec._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1));
    pvVar2 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
             operator[](&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,(long)index);
    NFABaseState<char,_Centaurus::IndexVector>::add_transition
              (&pvVar2->super_NFABaseState<char,_Centaurus::IndexVector>,&cc->first,dest,false);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
    __gnu_cxx::
    __normal_iterator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::operator++(&__end0_2);
  }
  for (; sVar5 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                 ::size(&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states),
      (ulong)(long)local_118 < sVar5; local_118 = local_118 + 1) {
    fork_states(this,local_118,
                (NFA<char> *)
                ds_factory.m_transitions.
                super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  NFADepartureSet<char>::~NFADepartureSet((NFADepartureSet<char> *)local_b0);
  NFADepartureSetFactory<char>::~NFADepartureSetFactory((NFADepartureSetFactory<char> *)&__range2);
  return;
}

Assistant:

void fork_states(int index, const NFA<TCHAR>& nfa)
	{
		NFADepartureSetFactory<TCHAR> ds_factory;

		for (int i : m_states[index].label())
		{
			for (const auto& tr : nfa.get_transitions(i))
			{
				ds_factory.add(tr);
			}
		}

		NFADepartureSet<TCHAR> deptset = ds_factory.build_departure_set();

		int initial_index = m_states.size();
		for (const auto& item : deptset)
		{
            bool long_flag = false;
			std::set<int> ec = nfa.epsilon_closure(item.second, long_flag);

			int new_index = add_state(ec, long_flag);

			//std::cout << "S" << index << "->" << new_index << std::endl;

			m_states[index].add_transition(item.first, new_index);
		}

		for (int i = initial_index; i < m_states.size(); i++)
		{
			fork_states(i, nfa);
		}
	}